

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Vertex_*>::btAlignedObjectArray
          (btAlignedObjectArray<btConvexHullInternal::Vertex_*> *this,
          btAlignedObjectArray<btConvexHullInternal::Vertex_*> *otherArray)

{
  uint newsize;
  Vertex *local_20;
  
  this->m_ownsMemory = true;
  this->m_data = (Vertex **)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  newsize = otherArray->m_size;
  local_20 = (Vertex *)0x0;
  resize(this,newsize,&local_20);
  copy(otherArray,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)newsize);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}